

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_sound_envs.cxx
# Opt level: O0

void __thiscall temp_box::temp_box(temp_box *this,cf_face *face,cf_vertex_vec *verts)

{
  uint uVar1;
  uint_fast32_t uVar2;
  bool bVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  ulong uVar6;
  float a;
  uint_fast32_t j;
  uint_fast32_t i_1;
  uint_fast32_t i;
  fvector3 edge [3];
  cf_vertex_vec *verts_local;
  cf_face *face_local;
  temp_box *this_local;
  
  this->state = 0;
  i_1 = 3;
  unique0x1000034c = verts;
  while (i_1 != 0) {
    pvVar4 = std::vector<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>::operator[]
                       (stack0xffffffffffffffe0,
                        (ulong)*(uint *)((long)&face->field_0 + (i_1 % 3) * 4));
    pvVar5 = std::vector<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>::operator[]
                       (stack0xffffffffffffffe0,(ulong)*(uint *)((long)face + (i_1 - 1) * 4));
    xray_re::_vector3<float>::sub
              ((_vector3<float> *)((long)&edge[i_1 - 2].field_0 + 4),&pvVar4->p,&pvVar5->p);
    i_1 = i_1 - 1;
  }
  j = 3;
  uVar2 = j;
  do {
    j = uVar2;
    if (j == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_sound_envs.cxx"
                    ,0x2f,"temp_box::temp_box(const cf_face &, const cf_vertex_vec &)");
    }
    uVar6 = j % 3;
    a = xray_re::_vector3<float>::cosine
                  ((_vector3<float> *)((long)&edge[j - 2].field_0 + 4),
                   (_vector3<float> *)((long)&edge[uVar6 - 1].field_0 + 4));
    bVar3 = xray_re::equivalent<float>(a,0.0,0.001);
    uVar2 = j - 1;
  } while (!bVar3);
  xray_re::_vector3<float>::invert
            ((_vector3<float> *)&this->xform,(_vector3<float> *)((long)&edge[j - 2].field_0 + 4));
  xray_re::_vector3<float>::set<float>
            (&(this->xform).field_0.field_1.j,
             (_vector3<float> *)((long)&edge[uVar6 - 1].field_0 + 4));
  uVar1 = *(uint *)((long)&face->field_0 + uVar6 * 4);
  this->base_idx = uVar1;
  pvVar4 = std::vector<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>::operator[]
                     (stack0xffffffffffffffe0,(ulong)uVar1);
  xray_re::_vector3<float>::set<float>(&(this->xform).field_0.field_1.c,&pvVar4->p);
  this->inner = (uint16_t)((face->field_1).dummy >> 0x10);
  this->outer = (ushort)(face->field_1).dummy & 0x3fff;
  return;
}

Assistant:

temp_box::temp_box(const cf_face& face, const cf_vertex_vec& verts): state(STATE_COLLECTING)
{
	fvector3 edge[3];
	for (uint_fast32_t i = 3; i != 0;) {
		--i;
		edge[i].sub(verts[face.v[(i+1)%3]].p, verts[face.v[i]].p);
	}
	for (uint_fast32_t i = 3; i != 0;) {
		uint_fast32_t j = i%3;
		if (equivalent(edge[--i].cosine(edge[j]), 0.f, k_zero_tolerance)) {
			xform.i.invert(edge[i]);
			xform.j.set(edge[j]);
			xform.c.set(verts[base_idx = face.v[j]].p);
			inner = face.sector;
			outer = face.material;
			return;
		}
	}
	xr_not_expected();
}